

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O2

EVdfg INT_EVdfg_create(EVmaster master)

{
  EVclient p_Var1;
  FILE *__stream;
  int iVar2;
  __pid_t _Var3;
  EVdfg client_data;
  pthread_t pVar4;
  EVdfg_configuration p_Var5;
  EVdfg_stone *pp_Var6;
  timespec ts;
  
  client_data = (EVdfg)INT_CMmalloc(0x58);
  client_data->client = (EVclient)0x0;
  client_data->master = (EVmaster)0x0;
  client_data->realized = 0;
  client_data->deploy_ack_count = 0;
  *(undefined8 *)&client_data->deploy_ack_condition = 0;
  client_data->stone_count = 0;
  client_data->deployed_stone_count = 0;
  client_data->stones = (EVdfg_stone *)0x0;
  client_data->deployed_state = (EVdfg_configuration)0x0;
  client_data->working_state = (EVdfg_configuration)0x0;
  client_data->transfer_events_count = 0;
  client_data->delete_count = 0;
  client_data->transfer_events_list = (int **)0x0;
  client_data->delete_list = (int **)0x0;
  client_data->master = master;
  client_data->deploy_ack_condition = -1;
  master->dfg = client_data;
  p_Var1 = master->client;
  if (p_Var1 != (EVclient)0x0) {
    p_Var1->dfg = client_data;
    client_data->client = p_Var1;
  }
  master->reconfig = 0;
  master->old_node_count = 1;
  master->sig_reconfig_bool = 0;
  master->state = DFG_Joining;
  iVar2 = CMtrace_val[0xd];
  if (master->cm->CMTrace_file == (FILE *)0x0) {
    iVar2 = CMtrace_init(master->cm,EVdfgVerbose);
  }
  if (iVar2 != 0) {
    if (CMtrace_PID != 0) {
      __stream = (FILE *)master->cm->CMTrace_file;
      _Var3 = getpid();
      pVar4 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var3,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,(timespec *)&ts);
      fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",ts.tv_sec,ts.tv_nsec);
    }
    fprintf((FILE *)master->cm->CMTrace_file,"EVDFG initialization -  master DFG state set to %s\n",
            str_state[master->state]);
  }
  fflush((FILE *)master->cm->CMTrace_file);
  p_Var5 = (EVdfg_configuration)INT_CMmalloc(0x20);
  *(undefined8 *)p_Var5 = 0;
  p_Var5->stones = (EVdfg_stone_state *)0x0;
  *(undefined8 *)&p_Var5->pending_action_count = 0;
  p_Var5->pending_action_queue = (_EVdfg_config_action *)0x0;
  client_data->working_state = p_Var5;
  pp_Var6 = (EVdfg_stone *)INT_CMmalloc(8);
  client_data->stones = pp_Var6;
  INT_CMadd_shutdown_task(master->cm,free_dfg,client_data,2);
  return client_data;
}

Assistant:

extern EVdfg
INT_EVdfg_create(EVmaster master)
{
    EVdfg dfg = malloc(sizeof(struct _EVdfg));

    memset(dfg, 0, sizeof(struct _EVdfg));
    dfg->master = master;
    dfg->deployed_stone_count = 0;
    dfg->deploy_ack_condition = -1;
    master->dfg = dfg;
    if (master->client) {
	master->client->dfg = dfg;
	dfg->client = master->client;
    }
    master->reconfig = 0;
    master->sig_reconfig_bool = 0;
    master->old_node_count = 1;
    master->state = DFG_Joining;
    CMtrace_out(master->cm, EVdfgVerbose, "EVDFG initialization -  master DFG state set to %s\n", str_state[master->state]);

    dfg->working_state = new_dfg_configuration(dfg);
    dfg->stones = malloc(sizeof(dfg->stones[0]));
    INT_CMadd_shutdown_task(master->cm, free_dfg, dfg, FREE_TASK);
    return dfg;
}